

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

void Sbl_ManClean(Sbl_Man_t *p)

{
  abctime aVar1;
  
  aVar1 = Abc_Clock();
  p->timeStart = aVar1;
  sat_solver_rollback(p->pSat);
  sat_solver_bookmark(p->pSat);
  p->vLeaves->nSize = 0;
  p->vAnds->nSize = 0;
  p->vNodes->nSize = 0;
  p->vRoots->nSize = 0;
  p->vRootVars->nSize = 0;
  p->vArrs->nSize = 0;
  p->vReqs->nSize = 0;
  Vec_WecClear(p->vWindow);
  p->vPath->nSize = 0;
  p->vEdges->nSize = 0;
  p->vCutsI1->nSize = 0;
  p->vCutsI2->nSize = 0;
  p->vCutsN1->nSize = 0;
  p->vCutsN2->nSize = 0;
  p->vCutsNum->nSize = 0;
  p->vCutsStart->nSize = 0;
  p->vCutsObj->nSize = 0;
  p->vSolInit->nSize = 0;
  p->vSolCur->nSize = 0;
  p->vSolBest->nSize = 0;
  p->vTempI1->nSize = 0;
  p->vTempI2->nSize = 0;
  p->vTempN1->nSize = 0;
  p->vTempN2->nSize = 0;
  p->vLits->nSize = 0;
  p->vAssump->nSize = 0;
  p->vPolar->nSize = 0;
  Gia_ManFillValue(p->pGia);
  return;
}

Assistant:

void Sbl_ManClean( Sbl_Man_t * p )
{
    p->timeStart = Abc_Clock();
    sat_solver_rollback( p->pSat );
    sat_solver_bookmark( p->pSat );
    // internal
    Vec_IntClear( p->vLeaves );
    Vec_IntClear( p->vAnds );
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vRoots );
    Vec_IntClear( p->vRootVars );
    // timing
    Vec_IntClear( p->vArrs );
    Vec_IntClear( p->vReqs );
    Vec_WecClear( p->vWindow );
    Vec_IntClear( p->vPath );
    Vec_IntClear( p->vEdges );
    // cuts
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Vec_IntClear( p->vCutsNum );
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vSolInit );
    Vec_IntClear( p->vSolCur );
    Vec_IntClear( p->vSolBest );
    Vec_WrdClear( p->vTempI1 );
    Vec_WrdClear( p->vTempI2 );
    Vec_WrdClear( p->vTempN1 );
    Vec_WrdClear( p->vTempN2 );
    // temporary
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vAssump );
    Vec_IntClear( p->vPolar );
    // other
    Gia_ManFillValue( p->pGia );
}